

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O0

int aes_ecb_decrypt(uchar *ibuf,uchar *obuf,int len,aes_decrypt_ctx *ctx)

{
  int iVar1;
  int local_34;
  int nb;
  aes_decrypt_ctx *ctx_local;
  uchar *puStack_20;
  int len_local;
  uchar *obuf_local;
  uchar *ibuf_local;
  
  local_34 = len >> 4;
  puStack_20 = obuf;
  obuf_local = ibuf;
  if ((len & 0xfU) == 0) {
    while (local_34 != 0) {
      iVar1 = aes_decrypt(obuf_local,puStack_20,ctx);
      if (iVar1 != 0) {
        return 1;
      }
      obuf_local = obuf_local + 0x10;
      puStack_20 = puStack_20 + 0x10;
      local_34 = local_34 + -1;
    }
    ibuf_local._4_4_ = 0;
  }
  else {
    ibuf_local._4_4_ = 1;
  }
  return ibuf_local._4_4_;
}

Assistant:

AES_RETURN aes_ecb_decrypt(const unsigned char *ibuf, unsigned char *obuf,
                    int len, const aes_decrypt_ctx ctx[1])
{   int nb = len >> 4;

    if(len & (AES_BLOCK_SIZE - 1))
        return EXIT_FAILURE;

#if defined( USE_VIA_ACE_IF_PRESENT )

    if(ctx->inf.b[1] == 0xff)
    {   uint8_t *ksp = kd_adr(ctx);
        via_cwd(cwd, hybrid, dec, 2 * ctx->inf.b[0] - 192);

        if(ALIGN_OFFSET( ctx, 16 ))
            return EXIT_FAILURE;

        if(!ALIGN_OFFSET( ibuf, 16 ) && !ALIGN_OFFSET( obuf, 16 ))
        {
            via_ecb_op5(ksp, cwd, ibuf, obuf, nb);
        }
        else
        {   aligned_auto(uint8_t, buf, BFR_BLOCKS * AES_BLOCK_SIZE, 16);
            uint8_t *ip, *op;

            while(nb)
            {
                int m = (nb > BFR_BLOCKS ? BFR_BLOCKS : nb);

                ip = (ALIGN_OFFSET( ibuf, 16 ) ? buf : ibuf);
                op = (ALIGN_OFFSET( obuf, 16 ) ? buf : obuf);

                if(ip != ibuf)
                    memcpy(buf, ibuf, m * AES_BLOCK_SIZE);

                via_ecb_op5(ksp, cwd, ip, op, m);

                if(op != obuf)
                    memcpy(obuf, buf, m * AES_BLOCK_SIZE);

                ibuf += m * AES_BLOCK_SIZE;
                obuf += m * AES_BLOCK_SIZE;
                nb -= m;
            }
        }

        return EXIT_SUCCESS;
    }

#endif

#if !defined( ASSUME_VIA_ACE_PRESENT )
    while(nb--)
    {
        if(aes_decrypt(ibuf, obuf, ctx) != EXIT_SUCCESS)
            return EXIT_FAILURE;
        ibuf += AES_BLOCK_SIZE;
        obuf += AES_BLOCK_SIZE;
    }
#endif
    return EXIT_SUCCESS;
}